

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void * ask_out(void)

{
  undefined8 in_RAX;
  char c;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  __isoc99_scanf("%c",(long)&uStack_18 + 7);
  if (uStack_18._7_1_ != 'q') {
    do {
      __isoc99_scanf("%c",(long)&uStack_18 + 7);
    } while (uStack_18._7_1_ != 'q');
  }
  puts("Closing server ...");
  server_deinit();
  exit(0);
}

Assistant:

void *ask_out() {
    while (1) {
        char c;
        scanf("%c", &c);
        if (c == 'q') {
            printf("Closing server ...\n");
            server_deinit();
            exit(0);
        }

    }
}